

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelDecode.cpp
# Opt level: O2

expected<idx2::brick_volume,_idx2::idx2_err_code> *
idx2::DecodeTask(expected<idx2::brick_volume,_idx2::idx2_err_code> *__return_storage_ptr__,
                idx2_file *Idx2,params *P,decode_data *D,decode_state Ds,grid OutGrid,f64 Tolerance,
                mmap_volume *OutVol,volume *OutVolMem)

{
  byte *pbVar1;
  dtype dVar2;
  out_mode oVar3;
  allocator *paVar4;
  ulong uVar5;
  int iVar6;
  i64 iVar7;
  decode_data *pdVar8;
  ulong uVar9;
  bitstream *pbVar10;
  byte bVar11;
  byte bVar12;
  char cVar13;
  int iVar14;
  unsigned_long *puVar15;
  ulong uVar16;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *peVar17;
  code *pcVar18;
  uint uVar19;
  short *Key;
  grid *Grid2;
  char *__function;
  byte bVar20;
  long lVar21;
  ushort uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  int iVar26;
  char cVar27;
  uint uVar28;
  byte *pbVar29;
  undefined8 uVar30;
  undefined4 uVar31;
  int iVar32;
  extent *this;
  u64 uVar33;
  brick_volume *pbVar34;
  uint uVar35;
  uint uVar36;
  long lVar37;
  int iVar38;
  uint uVar39;
  mmap_volume *pmVar40;
  uint uVar41;
  bool bVar42;
  v3i Brick3;
  i8 N;
  i16 BpKey;
  char local_8da;
  char local_8d9;
  ulong local_8d8;
  uint local_8d0;
  uint local_8cc;
  decode_data *local_8c8;
  int local_8bc;
  idx2_file *local_8b8;
  uint local_8b0;
  uint local_8a4;
  uint local_8a0;
  undefined4 local_89c;
  byte *local_898;
  ulong local_890;
  uint local_888;
  int local_884;
  int local_880;
  uint local_87c;
  long local_878;
  ulong local_870;
  undefined8 local_868;
  params *local_860;
  ulong local_858;
  ulong local_850;
  ulong local_848;
  u64 *local_840;
  ulong local_838;
  uint local_82c;
  int local_828;
  int local_824;
  uint local_820;
  uint local_81c;
  int local_818;
  uint local_814;
  uint local_810;
  uint local_80c;
  undefined7 local_808;
  idx2_err_code iStack_801;
  undefined7 uStack_800;
  expected<idx2::brick_volume,_idx2::idx2_err_code> *local_7f8;
  f64 local_7f0;
  ulong local_7e8;
  ulong local_7e0;
  ulong local_7d8;
  short *local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  ulong local_7b8;
  u64 Brick;
  mmap_volume *local_7a8;
  mmap_volume *local_7a0;
  array<idx2::subband> *local_798;
  v3i *local_790;
  long local_788;
  ulong local_780;
  ulong local_778;
  long local_770;
  byte *local_768;
  brick_volume *local_760;
  bitstream *local_758;
  ulong local_750;
  ulong local_748;
  ulong local_740;
  ulong local_738;
  ulong local_730;
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_idx2ParallelDecode_cpp:199:3)>
  __ScopeGuard__199;
  brick_volume BrickVol;
  brick_volume local_6d0;
  char local_690;
  unique_lock<std::mutex> Lock_1;
  undefined8 uStack_630;
  iterator StreamIt;
  int E;
  anon_union_160_2_4399d23d_for_expected<idx2::chunk_cache,_idx2::idx2_err_code>_3 aStack_600;
  bool local_560;
  u64 BrickKey_1;
  anon_union_64_2_4399d23d_for_expected<idx2::chunk_exp_cache,_idx2::idx2_err_code>_3 local_550;
  bool local_510;
  grid SbGridNonExt;
  chunk_cache ChunkCache;
  stream_cache Streams;
  extent PGrid;
  
  bVar20 = Ds.Level;
  uVar28 = 0;
  if ('\0' < (char)bVar20) {
    uVar28 = Ds._92_4_;
  }
  uVar28 = uVar28 & 0xff;
  iVar25 = 1;
  iVar32 = 1;
  iVar38 = 1;
  while (bVar42 = uVar28 != 0, uVar28 = uVar28 - 1, bVar42) {
    iVar32 = (Idx2->GroupBrick3).field_0.field_0.X * iVar32;
    iVar38 = iVar38 * (Idx2->GroupBrick3).field_0.field_0.Y;
    iVar25 = iVar25 * (Idx2->GroupBrick3).field_0.field_0.Z;
  }
  local_858 = (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X;
  local_848 = (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y;
  local_850 = (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Z;
  uStack_630 = Ds._88_8_;
  Lock_1._M_device = (mutex_type *)Ds.ParentBrick.Vol.Buffer.Data;
  Lock_1._8_8_ = Ds.ParentBrick.Vol.Buffer.Bytes;
  lVar37 = (long)(char)bVar20;
  local_8c8 = D;
  local_860 = P;
  local_7f8 = __return_storage_ptr__;
  local_7f0 = Tolerance;
  local_7a8 = OutVol;
  local_7a0 = (mmap_volume *)OutVolMem;
  brick_volume::brick_volume(&BrickVol);
  local_790 = &Idx2->BrickDimsExt3;
  Resize(&BrickVol.Vol,local_790,float64,local_8c8->Alloc);
  for (lVar21 = 0;
      ((long)(BrickVol.Vol.Dims << 0x16) >> 0x2b) * ((long)(BrickVol.Vol.Dims * 2) >> 0x2b) *
      ((long)(BrickVol.Vol.Dims << 0x2b) >> 0x2b) * 8 != lVar21; lVar21 = lVar21 + 8) {
    pbVar1 = BrickVol.Vol.Buffer.Data + lVar21;
    pbVar1[0] = '\0';
    pbVar1[1] = '\0';
    pbVar1[2] = '\0';
    pbVar1[3] = '\0';
    pbVar1[4] = '\0';
    pbVar1[5] = '\0';
    pbVar1[6] = '\0';
    pbVar1[7] = '\0';
  }
  Streams.LogCapacity = 0;
  Streams.Alloc = (allocator *)0x0;
  Streams.Keys = (short *)0x0;
  Streams.Vals = (bitstream *)0x0;
  Streams.Stats = (bucket_status *)0x0;
  Streams.Size = 0;
  __ScopeGuard__199.Dismissed = false;
  __ScopeGuard__199.Func.Streams = &Streams;
  Mallocator();
  Init<short,idx2::bitstream>(&Streams,7,&Mallocator::Instance.super_allocator);
  local_858 = (ulong)(uint)((int)local_858 * iVar32);
  local_848 = (ulong)(uint)((int)local_848 * iVar38);
  local_850 = (ulong)(uint)((int)local_850 * iVar25);
  local_798 = &Idx2->Subbands;
  local_828 = (char)bVar20 + 1;
  local_82c = (uint)(char)local_828;
  uVar30 = 0;
  uVar24 = 0;
  local_8b8 = Idx2;
  local_788 = lVar37;
  while( true ) {
    uVar16 = uStack_630;
    cVar27 = (char)uVar30;
    local_8a0 = (uint)cVar27;
    cVar13 = uStack_630._4_1_;
    if ((int)(char)(Idx2->Subbands).Size == local_8a0) break;
    if ('\x0f' < (char)lVar37) goto LAB_0016940b;
    if (((Idx2->DecodeSubbandMasks).Arr[lVar37] >> (local_8a0 & 0x1f) & 1) != 0) {
      pbVar1 = (Idx2->Subbands).Buffer.Data;
      local_840 = (u64 *)(pbVar1 + (long)cVar27 * 0x40);
      lVar37 = *(long *)(pbVar1 + (long)cVar27 * 0x40 + 8);
      iVar25 = (int)((lVar37 << 0x16) >> 0x2b);
      local_868 = uVar30;
      local_778 = uVar24;
      if ((cVar27 == '\0') && ((char)local_828 < Idx2->NLevels)) {
        local_8d0 = CONCAT31(local_8d0._1_3_,1 < iVar25);
        local_8b0 = CONCAT31(local_8b0._1_3_,1 < lVar37 * 2 >> 0x2b);
        local_8d8 = CONCAT44(local_8d8._4_4_,Ds.Brick3.field_0.field_0.Y);
        local_8cc = Ds.Brick3.field_0.field_0.Z;
        Brick3.field_0._0_8_ =
             (long)Ds.Brick3.field_0.field_0.Z / (long)(Idx2->GroupBrick3).field_0.field_0.Z &
             0xffffffff;
        Brick3.field_0._8_4_ =
             (int)((long)Ds.Brick3.field_0.field_0.X / (long)(Idx2->GroupBrick3).field_0.field_0.X);
        GetLinearBrick((idx2 *)Idx2,(idx2_file *)(ulong)local_82c,Brick3.field_0._8_4_,Brick3);
        uVar28 = local_8cc;
        uVar36 = (int)((lVar37 << 0x2b) >> 0x2b) - (uint)(1 < (lVar37 << 0x2b) >> 0x2b);
        uVar35 = iVar25 - (local_8d0 & 0xff);
        uVar41 = (int)(lVar37 * 2 >> 0x2b) - (local_8b0 & 0xff);
        SbGridNonExt.super_extent.From = *local_840;
        SbGridNonExt.Strd = local_840[2];
        SbGridNonExt.super_extent.Dims =
             (ulong)(uVar41 & 0x1fffff) << 0x2a |
             (ulong)(uVar35 & 0x1fffff) << 0x15 | (ulong)(uVar36 & 0x1fffff);
        PGrid.From = (ulong)(((int)local_8cc % (Idx2->GroupBrick3).field_0.field_0.Z) * uVar41 &
                            0x1fffff) << 0x2a |
                     (ulong)(((int)local_8d8 % (Idx2->GroupBrick3).field_0.field_0.Y) * uVar35 &
                            0x1fffff) << 0x15 |
                     (ulong)((Ds.Brick3.field_0.field_0.X % (Idx2->GroupBrick3).field_0.field_0.X) *
                             uVar36 & 0x1fffff);
        PGrid.Dims = SbGridNonExt.super_extent.Dims;
        CopyExtentGrid<double,double>(&PGrid,(volume *)&Lock_1,&SbGridNonExt,&BrickVol.Vol);
        Idx2 = local_8b8;
        if (((Ds.Brick3.field_0.field_0.X == 0 && (int)local_8d8 == 0) && uVar28 == 0) &&
           ((local_860->OutMode != HashMap ||
            (((undefined1  [96])Ds & (undefined1  [96])0x10000) == (undefined1  [96])0x0)))) {
          Dealloc((volume *)&Lock_1);
          Idx2 = local_8b8;
        }
      }
      uStack_630 = (ulong)CONCAT15((char)local_868,(undefined5)uStack_630);
      uVar9 = uStack_630;
      uStack_630._0_4_ = (int)uVar16;
      uVar35 = (uint)cVar13;
      Brick = Ds.Brick;
      uVar33 = local_840[1];
      local_7e8 = (long)(uVar33 * 2) >> 0x2b;
      uVar28 = ((int)uVar33 << 0xb) >> 0xb;
      local_7d8 = (ulong)uVar28;
      local_7e0 = (ulong)((long)(uVar33 << 0x16) >> 0xb) >> 0x20;
      iVar25 = (Idx2->BlockDims3).field_0.field_0.X;
      iVar32 = (Idx2->BlockDims3).field_0.field_0.Y;
      iVar38 = (Idx2->BlockDims3).field_0.field_0.Z;
      iVar14 = (int)((uVar33 << 0x16) >> 0x20);
      iVar6 = (int)(uVar33 * 2 >> 0x20);
      uVar24 = (long)(int)(iVar25 + -1 + uVar28) / (long)iVar25;
      local_7b8 = uVar24 & 0xffffffff;
      uVar16 = (long)(iVar32 + -1 + (iVar14 >> 0xb)) / (long)iVar32;
      local_7c0 = uVar16 & 0xffffffff;
      uVar5 = (long)((iVar6 >> 0xb) + iVar38 + -1) / (long)iVar38;
      local_7c8 = uVar5 & 0xffffffff;
      iVar26 = (int)uVar24 * (int)uVar5 * (int)uVar16;
      if (((char)local_868 == '\0') && ((int)(uVar35 + 1) < (int)Idx2->NLevels)) {
        iVar26 = iVar26 - (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | local_7e8 & 0xffffffff
                                      ) / (long)iVar38) * ((int)uVar28 / iVar25) *
                          (int)((long)((ulong)(uint)(iVar14 >> 0x1f) << 0x20 | local_7e0) /
                               (long)iVar32);
      }
      pbVar34 = (brick_volume *)(ulong)uVar35;
      ParallelReadChunkExponents
                ((expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *)&BrickKey_1,Idx2,local_8c8,
                 Ds.Brick,cVar13,(i8)local_8a0);
      if (local_510 != false) {
        bVar11 = Idx2->DType - int64;
        local_888 = 0;
        bVar12 = 0;
        if (bVar11 < 4) {
          bVar12 = (byte)*(undefined4 *)(&DAT_001987e0 + (ulong)bVar11 * 4);
        }
        lVar37 = (long)(iVar26 * (int)uStack_630 << (bVar12 & 0x1f));
        local_878 = CONCAT71(local_550._9_7_,local_550.Err.Code) + lVar37;
        local_870 = *(ulong *)(CONCAT71(local_550._9_7_,local_550.Err.Code) + lVar37);
        uVar41 = (int)local_7b8 - 1;
        uVar36 = (int)local_7c0 - 1;
        uVar28 = (int)local_7c8 - 1;
        local_87c = (((uVar28 * 0x100 & 0xffff | uVar28 * 0x10000 | uVar28 & 0xff) & 0x300f00f) *
                     0x11 & 0x30c30c3) * 0x14 & 0x24924924 |
                    (((uVar36 * 0x100 & 0xffff | uVar36 * 0x10000 | uVar36 & 0xff) & 0x300f00f) *
                     0x11 & 0x30c30c3) * 10 & 0x12492492 |
                    (((uVar41 * 0x100 & 0xffff | uVar41 * 0x10000 | uVar41 & 0xff) & 0x300f00f) *
                     0x11 & 0x30c30c3) * 5 & 0x9249249;
        Clear<short,idx2::bitstream>(&Streams);
        local_880 = uVar35 + 1;
        local_8a4 = 0;
        local_8cc = 0;
        local_760 = (brick_volume *)(ulong)uVar35;
LAB_0016804d:
        iVar25 = (Idx2->BlockDims3).field_0.field_0.X;
        local_8b0 = (Idx2->BlockDims3).field_0.field_0.Y;
        local_8d0 = (Idx2->BlockDims3).field_0.field_0.Z;
        local_8d8 = CONCAT44(local_8d8._4_4_,(int)Idx2->NLevels);
        uVar28 = local_87c;
        uVar35 = local_8cc;
        do {
          while( true ) {
            if (uVar28 < uVar35) {
              uVar28 = local_8a4 & 0xff;
              LOCK();
              (local_8c8->NInsignificantSubbands).super___atomic_base<long>._M_i =
                   (local_8c8->NInsignificantSubbands).super___atomic_base<long>._M_i +
                   (ulong)(byte)((byte)local_8a4 ^ 1);
              UNLOCK();
              if ((local_778 & 1) != 0) {
                uVar28 = 1;
              }
              uVar24 = (ulong)uVar28;
              uVar30 = local_868;
              Idx2 = local_8b8;
              lVar37 = local_788;
              uStack_630 = uVar9;
              goto LAB_00168f4d;
            }
            uVar41 = (uVar35 & 0x9249249) >> 2 | uVar35 & 0x9249249;
            uVar36 = uVar41 & 0x30c30c3;
            uVar36 = (uVar36 >> 4 | uVar36) & 0x300f00f;
            uVar36 = (uVar41 >> 0x10 & 0x300 | uVar36 >> 8 | uVar36) & 0x3ff;
            if ((int)uVar36 < (int)local_7b8) break;
LAB_00168240:
            iVar32 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> iVar32 & 1) == 0; iVar32 = iVar32 + 1) {
              }
            }
            bVar12 = (char)iVar32 + 1;
            if (uVar35 == 0) {
              bVar12 = 0;
            }
            uVar35 = (uVar35 >> (bVar12 & 0x1f)) + 1 << (bVar12 & 0x1f);
          }
          uVar39 = uVar35 >> 1 & 0x9249249;
          uVar41 = (uVar39 >> 2) + uVar39;
          uVar19 = uVar41 & 0x30c30c3;
          local_80c = (uVar19 >> 4 | uVar19) & 0x300f00f;
          local_810 = local_80c >> 8;
          uVar41 = (uVar41 >> 0x10 & 0x300 | local_810 | local_80c) & 0x3ff;
          if ((int)local_7c0 <= (int)uVar41) goto LAB_00168240;
          uVar19 = uVar35 >> 2 & 0x9249248;
          local_738 = (ulong)uVar19;
          local_730 = (ulong)(uVar35 & 0x24924924);
          uVar19 = (uVar35 & 0x24924924) + uVar19;
          uVar23 = uVar19 >> 2 & 0x30c30c3;
          local_814 = (uVar23 >> 4 | uVar23) & 0x300f00f;
          uVar23 = local_814 >> 8;
          uVar19 = (uVar19 >> 0x12 & 0x300 | uVar23 | local_814) & 0x3ff;
          if ((int)local_7c8 <= (int)uVar19) goto LAB_00168240;
          iVar32 = (int)local_7d8 - uVar36 * iVar25;
          uVar28 = (int)local_7e0 - uVar41 * local_8b0;
          uVar36 = (int)local_7e8 - uVar19 * local_8d0;
          local_8cc = uVar35;
          local_748 = (ulong)(uVar39 >> 2);
          local_740 = (ulong)uVar39;
          memset(&PGrid,0,0x200);
          if (((((char)local_868 != '\0') || ((int)local_8d8 <= local_880)) || (iVar32 < iVar25)) ||
             (((int)uVar28 < (int)local_8b0 || ((int)uVar36 < (int)local_8d0)))) goto LAB_00168258;
          uVar35 = local_8cc + 1;
          uVar28 = local_87c;
        } while( true );
      }
      local_808 = local_550._1_7_;
      iStack_801 = local_550.Err.Code;
      uStack_800 = local_550._9_7_;
      local_6d0.Vol.Buffer.Data._0_1_ = local_550.Val.ChunkPos._0_1_;
LAB_00168f81:
      local_6d0.Vol.Buffer.Data._1_7_ = local_808;
      local_6d0.Vol.Buffer.Bytes._0_1_ = iStack_801;
      local_6d0.Vol.Buffer.Bytes._1_7_ = uStack_800;
      local_690 = '\0';
      goto LAB_001690a5;
    }
LAB_00168f4d:
    uVar30 = CONCAT71((int7)((ulong)uVar30 >> 8),(char)uVar30 + '\x01');
  }
  pbVar34 = &BrickVol;
  InverseCdf53(local_790,(int)uStack_630._4_1_,local_798,&Idx2->TransformDetails,&pbVar34->Vol,
               (int)lVar37 + 1 == (int)Idx2->NLevels);
  BrickVol.DoneDecoding = true;
  BrickVol.Significant = (bool)((byte)uVar24 & 1);
  local_6d0.Vol.Buffer.Data._0_1_ = SUB81(BrickVol.Vol.Buffer.Data,0);
  local_6d0.Vol.Buffer.Data._1_7_ = (undefined7)((ulong)BrickVol.Vol.Buffer.Data >> 8);
  local_6d0.Vol.Buffer.Bytes._0_1_ = (idx2_err_code)BrickVol.Vol.Buffer.Bytes;
  local_6d0.Vol.Buffer.Bytes._1_7_ = (undefined7)((ulong)BrickVol.Vol.Buffer.Bytes >> 8);
  local_6d0.Vol.Buffer.Alloc = BrickVol.Vol.Buffer.Alloc;
  local_6d0.Vol.Dims = BrickVol.Vol.Dims;
  local_6d0.Vol.Type = BrickVol.Vol.Type;
  local_6d0.Vol._33_7_ = BrickVol.Vol._33_7_;
  local_6d0.ExtentLocal.From = BrickVol.ExtentLocal.From;
  local_6d0.ExtentLocal.Dims = BrickVol.ExtentLocal.Dims;
  local_6d0.NChildrenDecoded = BrickVol.NChildrenDecoded;
  local_6d0.NChildrenMax = BrickVol.NChildrenMax;
  local_6d0.DoneDecoding = true;
  local_6d0._60_4_ = BrickVol._60_4_;
  local_690 = '\x01';
  local_6d0.Significant = BrickVol.Significant;
LAB_001690a5:
  scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelDecode.cpp:199:3)>
  ::~scope_guard(&__ScopeGuard__199);
  pdVar8 = local_8c8;
  if (local_690 == '\0') {
    local_7f8->_vptr_expected = (_func_int **)&PTR__expected_001aeac0;
    (local_7f8->field_1).Val.Vol.Buffer.Data =
         (byte *)CONCAT71(local_6d0.Vol.Buffer.Data._1_7_,local_6d0.Vol.Buffer.Data._0_1_);
    (local_7f8->field_1).Val.Vol.Buffer.Bytes =
         CONCAT71(local_6d0.Vol.Buffer.Bytes._1_7_,(idx2_err_code)local_6d0.Vol.Buffer.Bytes);
    bVar42 = false;
    goto LAB_001693dc;
  }
  lVar37 = (long)(char)bVar20;
  if (lVar37 == 0) {
LAB_001691a2:
    PGrid.From = (ulong)((int)local_850 * Ds.Brick3.field_0.field_0.Z & 0x1fffff) << 0x2a |
                 (ulong)((int)local_848 * Ds.Brick3.field_0.field_0.Y & 0x1fffff) << 0x15 |
                 (ulong)((int)local_858 * Ds.Brick3.field_0.field_0.X & 0x1fffff);
    Grid2 = (grid *)((ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X & 0x1fffff);
    PGrid.Dims = (ulong)((Idx2->BrickDims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
                 ((ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
                 (ulong)Grid2;
    pbVar34 = (brick_volume *)(1L << (bVar20 & 0x3f) & 0x1fffff);
    Crop<idx2::grid,idx2::grid>((grid *)&E,(idx2 *)&OutGrid,(grid *)&PGrid,Grid2);
    Relative<idx2::grid,idx2::grid>((grid *)&ChunkCache,(idx2 *)&E,(grid *)&PGrid,Grid2);
    pdVar8 = local_8c8;
    oVar3 = local_860->OutMode;
    if (oVar3 < HashMap) {
      pmVar40 = local_7a0;
      if (oVar3 == RegularGridFile) {
        pmVar40 = local_7a8;
      }
      dVar2 = (pmVar40->Vol).Type;
      Relative<idx2::grid,idx2::grid>(&SbGridNonExt,(idx2 *)&E,&OutGrid,Grid2);
      if (dVar2 == float32) {
        pcVar18 = CopyGridGrid<double,float>;
      }
      else {
        pcVar18 = CopyGridGrid<double,double>;
      }
      (*pcVar18)(&ChunkCache,&local_6d0,&SbGridNonExt,pmVar40);
      Dealloc(&local_6d0);
    }
    else {
      if (oVar3 == HashMap) {
        if (local_6d0.Significant == true) {
          BrickKey_1 = (long)(int)(char)bVar20 + Ds.Brick * 0x10;
          std::unique_lock<std::mutex>::unique_lock(&Lock_1,&local_8c8->BrickPoolMutex);
          Insert<unsigned_long,idx2::brick_volume>
                    ((iterator *)&SbGridNonExt,(idx2 *)&pdVar8->BrickPool,
                     (hash_table<unsigned_long,_idx2::brick_volume> *)&BrickKey_1,
                     (unsigned_long *)&local_6d0,pbVar34);
          this = (extent *)&Lock_1;
          goto LAB_00169376;
        }
      }
      else if (oVar3 != NoOutput) goto LAB_001693ae;
      Dealloc(&local_6d0);
    }
  }
  else {
    if ('\x10' < (char)bVar20) {
LAB_0016940b:
      __function = 
      "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]";
LAB_00169420:
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,__function);
    }
    if ((Idx2->DecodeSubbandMasks).Arr[lVar37 + -1] == '\0') goto LAB_001691a2;
    if ((local_860->OutMode == HashMap) && (local_6d0.Significant == true)) {
      _E = (_func_int **)(Ds.Brick * 0x10 + lVar37);
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)&PGrid,&local_8c8->BrickPoolMutex);
      Insert<unsigned_long,idx2::brick_volume>
                ((iterator *)&SbGridNonExt,(idx2 *)&pdVar8->BrickPool,
                 (hash_table<unsigned_long,_idx2::brick_volume> *)&E,(unsigned_long *)&local_6d0,
                 pbVar34);
      this = &PGrid;
LAB_00169376:
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this);
    }
  }
LAB_001693ae:
  local_7f8->_vptr_expected = (_func_int **)&PTR__expected_001aeac0;
  (local_7f8->field_1).Val.Vol.Buffer.Data =
       (byte *)CONCAT71(local_6d0.Vol.Buffer.Data._1_7_,local_6d0.Vol.Buffer.Data._0_1_);
  (local_7f8->field_1).Val.Vol.Buffer.Bytes =
       CONCAT71(local_6d0.Vol.Buffer.Bytes._1_7_,(idx2_err_code)local_6d0.Vol.Buffer.Bytes);
  (local_7f8->field_1).Val.Vol.Buffer.Alloc = local_6d0.Vol.Buffer.Alloc;
  (local_7f8->field_1).Val.Vol.Dims = local_6d0.Vol.Dims;
  *(dtype *)((long)&local_7f8->field_1 + 0x20) = local_6d0.Vol.Type;
  *(undefined7 *)((long)&local_7f8->field_1 + 0x21) = local_6d0.Vol._33_7_;
  (local_7f8->field_1).Val.ExtentLocal.From = local_6d0.ExtentLocal.From;
  (local_7f8->field_1).Val.ExtentLocal.Dims = local_6d0.ExtentLocal.Dims;
  *(ulong *)((long)&local_7f8->field_1 + 0x38) =
       CONCAT44(local_6d0._60_4_,
                CONCAT13(local_6d0.DoneDecoding,CONCAT12(local_6d0.Significant,local_6d0._56_2_)));
  bVar42 = true;
LAB_001693dc:
  local_7f8->Ok = bVar42;
  return local_7f8;
LAB_00168258:
  if (iVar32 < iVar25) {
    iVar25 = iVar32;
  }
  if ((int)local_8b0 <= (int)uVar28) {
    uVar28 = local_8b0;
  }
  if ((int)local_8d0 <= (int)uVar36) {
    uVar36 = local_8d0;
  }
  local_838 = (ulong)uVar36;
  uVar28 = (uint)(1 < (int)uVar36) + (uint)(1 < (int)uVar28) + (uint)(1 < iVar25);
  local_8d8 = (ulong)(uint)(1 << (char)uVar28 * '\x02');
  dVar2 = local_8b8->DType;
  if ((dVar2 < 10) && ((0x2c0U >> (dVar2 & 0x1f) & 1) != 0)) {
    if (0x30 < (int)local_888) {
      local_870 = *(ulong *)(local_878 + (ulong)(local_888 >> 3));
      local_878 = (ulong)(local_888 >> 3) + local_878;
      local_888 = local_888 & 7;
    }
    uVar22 = (ushort)(local_870 >> ((byte)local_888 & 0x3f)) & (ushort)bitstream::Masks.Arr[0x10];
    local_888 = local_888 + 0x10;
    iVar25 = -0x3ff;
  }
  else {
    if (0x38 < (int)local_888) {
      local_870 = *(ulong *)(local_878 + (ulong)(local_888 >> 3));
      local_878 = (ulong)(local_888 >> 3) + local_878;
      local_888 = local_888 & 7;
    }
    uVar22 = (ushort)(local_870 >> ((byte)local_888 & 0x3f)) & (ushort)bitstream::Masks.Arr[8];
    local_888 = local_888 + 8;
    iVar25 = -0x7f;
  }
  N = '\0';
  local_884 = 0x40;
  if (dVar2 < __Invalid__) {
    local_884 = *(int *)(&DAT_00198b50 + (ulong)dVar2 * 4);
  }
  local_81c = uVar23;
  if (((double)local_7f0 != 0.0) || (NAN((double)local_7f0))) {
    frexp((double)local_7f0,&E);
    local_8bc = E;
    if (E < -0x3fd) {
      local_8bc = -0x3fe;
    }
    local_8bc = local_8bc + -6;
  }
  else {
    local_8bc = -0x405;
  }
  local_820 = uVar28 ^ 0x3f;
  local_750 = (ulong)(uint)((short)uVar22 + iVar25);
  local_824 = (int)(short)((short)uVar22 + iVar25);
  local_8bc = local_8bc - local_824;
  local_818 = local_8b8->BitPlanesPerChunk;
  iVar25 = (int)local_8d8;
  uVar31 = 0;
  cVar13 = '?';
  local_780 = (ulong)uVar28;
  while (Key = (short *)(ulong)(uint)(int)cVar13, local_884 <= cVar13) {
    iVar38 = (int)(short)((short)local_750 + (short)cVar13);
    iVar32 = iVar38 + 0x400;
    BpKey = (i16)(iVar32 / local_818);
    iVar32 = iVar32 % local_818;
    local_8d9 = cVar13;
    local_89c = uVar31;
    local_7d0 = Key;
    if (((double)local_7f0 != 0.0) || (NAN((double)local_7f0))) {
      frexp((double)local_7f0,&E);
      Key = (short *)0xfffffc02;
      iVar14 = E;
      if (E < -0x3fd) {
        iVar14 = -0x3fe;
      }
    }
    else {
      iVar14 = -0x3ff;
    }
    iVar38 = iVar38 - iVar14;
    if ((iVar38 < 0x39) && (uVar31 = local_89c, iVar32 == 0)) break;
    Lookup<short,idx2::bitstream>
              (&StreamIt,(idx2 *)&Streams,(hash_table<short,_idx2::bitstream> *)&BpKey,Key);
    if ((StreamIt.Ht)->Stats[StreamIt.Idx] != Occupied) {
      pbVar34 = local_760;
      ParallelReadChunk((expected<idx2::chunk_cache,_idx2::idx2_err_code> *)&E,local_8b8,local_8c8,
                        Brick,(i8)local_760,(i8)local_8a0,BpKey);
      if (local_560 != true) {
        local_808 = aStack_600._1_7_;
        iStack_801 = aStack_600.Err.Code;
        uStack_800 = aStack_600._9_7_;
        Idx2 = local_8b8;
        local_6d0.Vol.Buffer.Data._0_1_ = aStack_600.Val.ChunkPos._0_1_;
        goto LAB_00168f81;
      }
      memcpy(&ChunkCache,&aStack_600,0xa0);
      puVar15 = BinarySearch<unsigned_long,unsigned_long*>
                          ((unsigned_long *)ChunkCache.Bricks.Buffer.Data,
                           (unsigned_long *)
                           (ChunkCache.Bricks.Buffer.Data + ChunkCache.Bricks.Size * 8),&Brick);
      iVar32 = *(int *)(ChunkCache.BrickOffsets.Buffer.Data +
                       ((long)puVar15 - (long)ChunkCache.Bricks.Buffer.Data >> 1));
      Insert<short,idx2::bitstream>(&StreamIt,&BpKey,&ChunkCache.ChunkStream);
      pbVar1 = ((StreamIt.Val)->Stream).Data;
      (StreamIt.Val)->BitPtr = pbVar1 + iVar32;
      (StreamIt.Val)->BitBuf = *(u64 *)(pbVar1 + iVar32);
      (StreamIt.Val)->BitPos = 0;
    }
    pbVar10 = StreamIt.Val;
    local_8da = 0x38 < iVar38;
    pbVar1 = ((StreamIt.Val)->Stream).Data;
    local_898 = (StreamIt.Val)->BitPtr;
    uVar28 = (StreamIt.Val)->BitPos;
    local_890 = (ulong)uVar28;
    if (local_8bc < 8) {
      Decode<unsigned_long>(&PGrid.From,(int)local_8d8,(int)local_7d0,&N,StreamIt.Val,false);
      pbVar29 = pbVar10->BitPtr;
      uVar28 = pbVar10->BitPos;
    }
    else {
      paVar4 = ((StreamIt.Val)->Stream).Alloc;
      aStack_600.Err.Code = (idx2_err_code)paVar4;
      aStack_600._9_7_ = (undefined7)((ulong)paVar4 >> 8);
      _E = (_func_int **)((StreamIt.Val)->Stream).Data;
      iVar7 = ((StreamIt.Val)->Stream).Bytes;
      aStack_600.Val.ChunkPos._0_1_ = (undefined1)iVar7;
      aStack_600._1_7_ = (undefined7)((ulong)iVar7 >> 8);
      local_758 = StreamIt.Val;
      uVar24 = (StreamIt.Val)->BitBuf;
      uVar35 = (uint)N;
      pbVar29 = local_898;
      if ((int)uVar35 < 1) {
        uVar33 = 0;
        uVar16 = local_890;
      }
      else {
        uVar41 = 0x40 - uVar28;
        uVar36 = uVar35;
        if ((int)uVar41 < (int)uVar35) {
          uVar36 = uVar41;
        }
        if (0x40 < (int)uVar36) {
LAB_001693f4:
          __function = 
          "t &idx2::stack_array<unsigned long, 65>::operator[](int) const [t = unsigned long, N = 65]"
          ;
          goto LAB_00169420;
        }
        uVar33 = uVar24 >> ((byte)uVar28 & 0x3f) & bitstream::Masks.Arr[(int)uVar36];
        uVar36 = uVar36 + uVar28;
        uVar16 = (ulong)uVar36;
        iVar32 = uVar35 - uVar41;
        if (iVar32 != 0 && (int)uVar41 <= (int)uVar35) {
          local_768 = pbVar1;
          if (0x40 < iVar32) goto LAB_001693f4;
          local_770 = (long)((int)uVar36 >> 3);
          uVar24 = *(ulong *)(local_898 + local_770);
          uVar33 = uVar33 | (uVar24 >> (sbyte)(uVar36 & 7) & bitstream::Masks.Arr[iVar32]) <<
                            ((byte)uVar41 & 0x3f);
          uVar16 = (ulong)((uVar36 & 7) + iVar32);
          pbVar29 = local_898 + local_770;
        }
      }
      while (uVar28 = (uint)uVar16, (char)uVar35 < (int)local_8d8) {
        if (0x3f < (int)uVar28) {
          uVar24 = *(ulong *)(pbVar29 + (uVar16 >> 3));
          pbVar29 = pbVar29 + (uVar16 >> 3);
          uVar28 = uVar28 & 7;
        }
        bVar12 = (byte)uVar28;
        uVar28 = uVar28 + 1;
        uVar16 = (ulong)uVar28;
        if ((uVar24 >> (bVar12 & 0x3f) & bitstream::Masks.Arr[1]) == 0) break;
        while( true ) {
          uVar28 = (uint)uVar16;
          bVar12 = (byte)uVar35;
          if (iVar25 + -1 <= (int)(char)bVar12) break;
          if (0x3f < (int)uVar28) {
            uVar24 = *(ulong *)(pbVar29 + (uVar16 >> 3));
            pbVar29 = pbVar29 + (uVar16 >> 3);
            uVar28 = uVar28 & 7;
          }
          uVar16 = (ulong)(uVar28 + 1);
          if ((uVar24 >> ((byte)uVar28 & 0x3f) & bitstream::Masks.Arr[1]) != 0) break;
          uVar35 = (uint)(byte)(bVar12 + 1);
        }
        uVar35 = uVar35 + 1;
        N = (i8)uVar35;
        uVar33 = uVar33 + (1L << (bVar12 & 0x3f));
      }
      (&PGrid.From)[0x3f - (int)local_7d0] = uVar33;
      ((StreamIt.Val)->Stream).Alloc = paVar4;
      ((StreamIt.Val)->Stream).Data = (byte *)_E;
      ((StreamIt.Val)->Stream).Bytes = iVar7;
      (StreamIt.Val)->BitPtr = pbVar29;
      (StreamIt.Val)->BitBuf = uVar24;
      (StreamIt.Val)->BitPos = uVar28;
    }
    uVar31 = CONCAT31((int3)((uint)local_89c >> 8),(char)local_89c + local_8da);
    LOCK();
    (local_8c8->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
         (local_8c8->BytesDecoded_).super___atomic_base<unsigned_long>._M_i +
         ((long)(int)uVar28 - (long)(int)local_890) +
         (long)(pbVar29 + ((long)pbVar1 - (long)(local_898 + (long)(pbVar10->Stream).Data))) * 8;
    UNLOCK();
    cVar13 = local_8d9 + -1;
  }
  pdVar8 = local_8c8;
  if ('\0' < (char)uVar31) {
    if (7 < local_8bc) {
      TransposeRecursive<unsigned_long>(&PGrid.From,(int)(char)uVar31);
    }
    LOCK();
    (pdVar8->NSignificantBlocks).super___atomic_base<long>._M_i =
         (pdVar8->NSignificantBlocks).super___atomic_base<long>._M_i + 1;
    UNLOCK();
    peVar17 = (expected<idx2::brick_volume,_idx2::idx2_err_code> *)
              (*(code *)(&DAT_001987f0 + *(int *)(&DAT_001987f0 + (local_780 & 0xffffffff) * 4)))();
    return peVar17;
  }
  local_8cc = local_8cc + 1;
  Idx2 = local_8b8;
  goto LAB_0016804d;
}

Assistant:

expected<brick_volume, idx2_err_code>
DecodeTask(const idx2_file& Idx2,
           const params& P,
           decode_data* D,
           decode_state Ds,
           grid OutGrid,
           f64 Tolerance,
           mmap_volume* OutVol,
           volume* OutVolMem)
{
  v3i B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Ds.Level);
  /* --------------- Decode the brick --------------- */
  auto Result = ParallelDecodeBrick(Idx2, P, D, Ds, Tolerance);
  if (!Result)
    return Error(Result);
  // Copy the samples out to the output buffer (or file)
  // The Idx2.DecodeSubbandMasks[Level - 1] == 0 means that no subbands on the next level
  // will be decoded, so we can now just copy the result out
  brick_volume& BVol = Value(Result);
  if (Ds.Level == 0 || Idx2.DecodeSubbandMasks[Ds.Level - 1] == 0)
  {
    grid BrickGrid(Ds.Brick3 * B3, Idx2.BrickDims3, v3i(1 << Ds.Level));
    grid OutBrickGrid = Crop(OutGrid, BrickGrid);
    grid BrickGridLocal = Relative(OutBrickGrid, BrickGrid);
    if (P.OutMode == params::out_mode::RegularGridFile ||
        P.OutMode == params::out_mode::RegularGridMem)
    {
      auto OutputVol =
        P.OutMode == params::out_mode::RegularGridFile ? &OutVol->Vol : OutVolMem;
      auto CopyFunc = OutputVol->Type == dtype::float32 ? (CopyGridGrid<f64, f32>)
                                                        : (CopyGridGrid<f64, f64>);
      CopyFunc(BrickGridLocal, BVol.Vol, Relative(OutBrickGrid, OutGrid), OutputVol);
      Dealloc(&BVol); // TODO: dealloc here or outside?
    }
    else if (P.OutMode == params::out_mode::HashMap)
    {
      if (!BVol.Significant)
      {
        Dealloc(&BVol);
      }
      else
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
    else if (P.OutMode == params::out_mode::NoOutput)
    {
      Dealloc(&BVol);
    }
  }
  else // not the finest level
  {
    if (P.OutMode == params::out_mode::HashMap)
    {
      if (BVol.Significant)
      {
        u64 BrickKey = GetBrickKey(Ds.Level, Ds.Brick);
        std::unique_lock<std::mutex> Lock(D->BrickPoolMutex);
        Insert(&D->BrickPool.BrickTable, BrickKey, BVol);
      }
    }
  }

  return Value(Result);
}